

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_node_tec_part
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  uint uVar1;
  REF_GLOB *original;
  double local_f0;
  double local_e8;
  double local_e0;
  int local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB *sorted_cellnode;
  REF_INT position;
  REF_INT total_cellnode;
  REF_INT *pack;
  REF_INT *sorted_local;
  REF_INT dim;
  REF_STATUS status;
  REF_INT id;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB global;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_48;
  REF_INT chunk;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_DBL *scalar_local;
  REF_GLOB *pRStack_28;
  REF_INT ldim_local;
  REF_GLOB *l2c_local;
  REF_GLOB nnode_local;
  REF_NODE ref_node_local;
  
  pRStack_48 = ref_node->ref_mpi;
  sorted_local._0_4_ = ldim + 4;
  sorted_cellnode._4_4_ = 0;
  for (status = 0; status < ref_node->max; status = status + 1) {
    if ((l2c[status] != -1) && (ref_node->ref_mpi->id == ref_node->part[status])) {
      sorted_cellnode._4_4_ = sorted_cellnode._4_4_ + 1;
    }
  }
  ref_mpi = (REF_MPI)file;
  file_local = (FILE *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_28 = l2c;
  l2c_local = (REF_GLOB *)nnode;
  nnode_local = (REF_GLOB)ref_node;
  if (sorted_cellnode._4_4_ < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x96,
           "ref_gather_node_tec_part","malloc sorted_local of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pack = (REF_INT *)malloc((long)sorted_cellnode._4_4_ << 2);
    if (pack == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x96
             ,"ref_gather_node_tec_part","malloc sorted_local of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else if (sorted_cellnode._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x97
             ,"ref_gather_node_tec_part","malloc sorted_cellnode of REF_GLOB negative");
      ref_node_local._4_4_ = 1;
    }
    else {
      original = (REF_GLOB *)malloc((long)sorted_cellnode._4_4_ << 3);
      if (original == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x97,"ref_gather_node_tec_part","malloc sorted_cellnode of REF_GLOB NULL");
        ref_node_local._4_4_ = 2;
      }
      else if (sorted_cellnode._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x98,"ref_gather_node_tec_part","malloc pack of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        _position = malloc((long)sorted_cellnode._4_4_ << 2);
        if (_position == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x98,"ref_gather_node_tec_part","malloc pack of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          sorted_cellnode._4_4_ = 0;
          for (status = 0; status < *(int *)(nnode_local + 4); status = status + 1) {
            if ((pRStack_28[status] != -1) &&
               (*(int *)(*(long *)(nnode_local + 0x50) + 4) ==
                *(int *)(*(long *)(nnode_local + 0x28) + (long)status * 4))) {
              original[sorted_cellnode._4_4_] = pRStack_28[status];
              *(REF_STATUS *)((long)_position + (long)sorted_cellnode._4_4_ * 4) = status;
              sorted_cellnode._4_4_ = sorted_cellnode._4_4_ + 1;
            }
          }
          uVar1 = ref_sort_heap_glob(sorted_cellnode._4_4_,original,pack);
          if (uVar1 == 0) {
            for (status = 0; status < sorted_cellnode._4_4_; status = status + 1) {
              pack[status] = *(REF_INT *)((long)_position + (long)pack[status] * 4);
              original[status] = pRStack_28[pack[status]];
            }
            if (_position != (void *)0x0) {
              free(_position);
            }
            local_c0 = (int)((long)l2c_local / (long)pRStack_48->n) + 1;
            if (local_c0 < 0x186a1) {
              local_c0 = 100000;
            }
            if (pRStack_48->reduce_byte_limit < 1) {
              local_c8 = 0x7fffffff;
            }
            else {
              local_c8 = pRStack_48->reduce_byte_limit / ((int)sorted_local << 3);
            }
            if (local_c0 < local_c8) {
              local_cc = local_c0;
            }
            else {
              if (pRStack_48->reduce_byte_limit < 1) {
                local_d0 = 0x7fffffff;
              }
              else {
                local_d0 = pRStack_48->reduce_byte_limit / ((int)sorted_local << 3);
              }
              local_cc = local_d0;
            }
            local_xyzm._4_4_ = local_cc;
            if ((int)sorted_local * local_cc < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xaf,"ref_gather_node_tec_part","malloc local_xyzm of REF_DBL negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              xyzm = (REF_DBL *)malloc((long)((int)sorted_local * local_cc) << 3);
              if (xyzm == (REF_DBL *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xaf,"ref_gather_node_tec_part","malloc local_xyzm of REF_DBL NULL");
                ref_node_local._4_4_ = 2;
              }
              else if ((int)sorted_local * local_xyzm._4_4_ < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0xb0,"ref_gather_node_tec_part","malloc xyzm of REF_DBL negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                nnode_written = (REF_GLOB)malloc((long)((int)sorted_local * local_xyzm._4_4_) << 3);
                if ((void *)nnode_written == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0xb0,"ref_gather_node_tec_part","malloc xyzm of REF_DBL NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  first = 0;
                  while (first < (long)l2c_local) {
                    global = first;
                    if ((long)local_xyzm._4_4_ < (long)l2c_local - first) {
                      local_d8 = local_xyzm._4_4_;
                    }
                    else {
                      local_d8 = (int)l2c_local - (int)first;
                    }
                    id = local_d8;
                    first = local_d8 + first;
                    for (status = 0; status < (int)sorted_local * local_xyzm._4_4_;
                        status = status + 1) {
                      xyzm[status] = 0.0;
                    }
                    for (status = 0; status < id; status = status + 1) {
                      _n = global + status;
                      uVar1 = ref_sort_search_glob
                                        (sorted_cellnode._4_4_,original,_n,
                                         (REF_INT *)&sorted_cellnode);
                      sorted_local._4_4_ = uVar1;
                      if ((uVar1 != 0) && (uVar1 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xbf,"ref_gather_node_tec_part",(ulong)uVar1,"node local failed");
                        return uVar1;
                      }
                      if (uVar1 == 0) {
                        i = pack[(int)sorted_cellnode];
                        xyzm[(int)sorted_local * status] =
                             *(REF_DBL *)(*(long *)(nnode_local + 0x38) + (long)(i * 0xf) * 8);
                        xyzm[(int)sorted_local * status + 1] =
                             *(REF_DBL *)(*(long *)(nnode_local + 0x38) + (long)(i * 0xf + 1) * 8);
                        xyzm[(int)sorted_local * status + 2] =
                             *(REF_DBL *)(*(long *)(nnode_local + 0x38) + (long)(i * 0xf + 2) * 8);
                        for (dim = 0; dim < scalar_local._4_4_; dim = dim + 1) {
                          xyzm[dim + 3 + (int)sorted_local * status] =
                               *(REF_DBL *)
                                (&file_local->_flags + (long)(dim + scalar_local._4_4_ * i) * 2);
                        }
                        xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] = 1.0;
                      }
                    }
                    for (status = 0; status < id; status = status + 1) {
                      if (xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] - 1.0 <= 0.0) {
                        local_e0 = -(xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] - 1.0
                                    );
                      }
                      else {
                        local_e0 = xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] - 1.0;
                      }
                      if (0.1 < local_e0) {
                        if (xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] - 0.0 <= 0.0)
                        {
                          local_e8 = -(xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] -
                                      0.0);
                        }
                        else {
                          local_e8 = xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status] - 0.0
                          ;
                        }
                        if (0.1 < local_e8) {
                          printf("%s: %d: %s: before sum %ld %f\n",
                                 xyzm[scalar_local._4_4_ + 3 + (int)sorted_local * status],
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xd0,"ref_gather_node_tec_part",global + status);
                        }
                      }
                    }
                    uVar1 = ref_mpi_sum(pRStack_48,xyzm,(void *)nnode_written,(int)sorted_local * id
                                        ,3);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0xd4,"ref_gather_node_tec_part",(ulong)uVar1,"sum");
                      return uVar1;
                    }
                    if (pRStack_48->id == 0) {
                      for (status = 0; status < id; status = status + 1) {
                        if (*(double *)
                             (nnode_written +
                             (long)(scalar_local._4_4_ + 3 + (int)sorted_local * status) * 8) - 1.0
                            <= 0.0) {
                          local_f0 = -(*(double *)
                                        (nnode_written +
                                        (long)(scalar_local._4_4_ + 3 + (int)sorted_local * status)
                                        * 8) - 1.0);
                        }
                        else {
                          local_f0 = *(double *)
                                      (nnode_written +
                                      (long)(scalar_local._4_4_ + 3 + (int)sorted_local * status) *
                                      8) - 1.0;
                        }
                        if (0.1 < local_f0) {
                          printf("%s: %d: %s: after sum %ld %f\n",
                                 *(undefined8 *)
                                  (nnode_written +
                                  (long)(scalar_local._4_4_ + 3 + (int)sorted_local * status) * 8),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xda,"ref_gather_node_tec_part",global + status);
                        }
                        for (dim = 0; dim < scalar_local._4_4_ + 3; dim = dim + 1) {
                          fprintf((FILE *)ref_mpi," %.15e",
                                  *(undefined8 *)
                                   (nnode_written + (long)(dim + (int)sorted_local * status) * 8));
                        }
                        fprintf((FILE *)ref_mpi," \n");
                      }
                    }
                  }
                  if (nnode_written != 0) {
                    free((void *)nnode_written);
                  }
                  if (xyzm != (REF_DBL *)0x0) {
                    free(xyzm);
                  }
                  if (original != (REF_GLOB *)0x0) {
                    free(original);
                  }
                  if (pack != (REF_INT *)0x0) {
                    free(pack);
                  }
                  ref_node_local._4_4_ = 0;
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xa3,"ref_gather_node_tec_part",(ulong)uVar1,"sort");
            ref_node_local._4_4_ = uVar1;
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_part(REF_NODE ref_node,
                                                   REF_GLOB nnode,
                                                   REF_GLOB *l2c, REF_INT ldim,
                                                   REF_DBL *scalar,
                                                   FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, id;
  REF_STATUS status;
  REF_INT dim = 3 + ldim + 1;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, dim * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, dim * chunk, REF_DBL);
  ref_malloc(xyzm, dim * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < nnode) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

    nnode_written += n;

    for (i = 0; i < dim * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                    &position);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status) {
        local = sorted_local[position];
        local_xyzm[0 + dim * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + dim * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + dim * i] = ref_node_xyz(ref_node, 2, local);
        for (id = 0; id < ldim; id++) {
          local_xyzm[3 + id + dim * i] = scalar[id + ldim * local];
        }
        local_xyzm[3 + ldim + dim * i] = 1.0;
      }
    }

    for (i = 0; i < n; i++) {
      if ((ABS(local_xyzm[3 + ldim + dim * i] - 1.0) > 0.1) &&
          (ABS(local_xyzm[3 + ldim + dim * i] - 0.0) > 0.1)) {
        printf("%s: %d: %s: before sum " REF_GLOB_FMT " %f\n", __FILE__,
               __LINE__, __func__, first + i, local_xyzm[3 + ldim + dim * i]);
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, dim * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi)) {
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + ldim + dim * i] - 1.0) > 0.1) {
          printf("%s: %d: %s: after sum " REF_GLOB_FMT " %f\n", __FILE__,
                 __LINE__, __func__, first + i, xyzm[3 + ldim + dim * i]);
        }
        for (id = 0; id < 3 + ldim; id++) {
          fprintf(file, " %.15e", xyzm[id + dim * i]);
        }
        fprintf(file, " \n");
      }
    }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}